

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hpp
# Opt level: O0

void __thiscall BCL::debug_error::debug_error(debug_error *this,string *what_arg)

{
  string *what_arg_local;
  debug_error *this_local;
  
  error::error(&this->super_error);
  std::__cxx11::string::string((string *)&this->what_arg_,(string *)what_arg);
  return;
}

Assistant:

debug_error(const std::string& what_arg) : what_arg_(what_arg) {}